

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t node,real score,Predictions *predictions,
          Vector *hidden)

{
  int32_t node_00;
  int iVar1;
  pointer pNVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  float fVar5;
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  double dVar9;
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  float local_2c;
  int local_28;
  float local_24;
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = score;
  local_28 = node;
  while( true ) {
    auVar7 = auVar10._0_16_;
    local_2c = auVar10._0_4_;
    lVar6 = (long)local_28;
    pNVar2 = (this->tree_).
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pNVar2[lVar6].left == -1) && (pNVar2[lVar6].right == -1)) break;
    peVar3 = (((this->super_BinaryLogisticLoss).super_Loss.wo_)->
             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar3->_vptr_Matrix[2])(peVar3,hidden,lVar6 - this->osz_);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar7,auVar4);
    fVar8 = expf(auVar7._0_4_);
    fVar5 = local_2c;
    local_24 = 1.0 / (fVar8 + 1.0);
    node_00 = (this->tree_).
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[local_28].left;
    dVar9 = log((double)(1.0 - local_24) + 1e-05);
    dfs(this,node_00,(float)dVar9 + fVar5,predictions,hidden);
    fVar5 = local_2c;
    iVar1 = (this->tree_).
            super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[local_28].right;
    dVar9 = log((double)local_24 + 1e-05);
    auVar10 = ZEXT464((uint)((float)dVar9 + fVar5));
    local_28 = iVar1;
  }
  std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::emplace_back<float&,int&>
            ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)predictions,
             &local_2c,&local_28);
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t node,
    real score,
    Predictions& predictions,
    const Vector& hidden) const {

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    predictions.emplace_back(score, node);
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(tree_[node].left, score + std_log(1.0 - f), predictions, hidden);
  dfs(tree_[node].right, score + std_log(f), predictions, hidden);
}